

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QToolBarAreaLayout::itemAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  QList<QToolBarAreaLayoutLine> *this_00;
  qsizetype qVar2;
  const_reference pQVar3;
  const_reference pQVar4;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  long in_stack_ffffffffffffffa8;
  int local_3c;
  int local_2c;
  int local_20;
  
  local_20 = 0;
  do {
    if (3 < local_20) {
      return (QLayoutItem *)0x0;
    }
    local_2c = 0;
    while( true ) {
      this_00 = (QList<QToolBarAreaLayoutLine> *)(long)local_2c;
      qVar2 = QList<QToolBarAreaLayoutLine>::size
                        ((QList<QToolBarAreaLayoutLine> *)(in_RDI + 0x18 + (long)local_20 * 0x38));
      if (qVar2 <= (long)this_00) break;
      pQVar3 = QList<QToolBarAreaLayoutLine>::at(this_00,in_stack_ffffffffffffffa8);
      local_3c = 0;
      while( true ) {
        in_stack_ffffffffffffffa8 = (long)local_3c;
        qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems);
        if (qVar2 <= in_stack_ffffffffffffffa8) break;
        iVar1 = *in_RSI;
        *in_RSI = iVar1 + 1;
        if (iVar1 == in_EDX) {
          pQVar4 = QList<QToolBarAreaLayoutItem>::at
                             ((QList<QToolBarAreaLayoutItem> *)this_00,in_stack_ffffffffffffffa8);
          return pQVar4->widgetItem;
        }
        local_3c = local_3c + 1;
      }
      local_2c = local_2c + 1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

QLayoutItem *QToolBarAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index)
                    return line.toolBarItems.at(k).widgetItem;
            }
        }
    }

    return nullptr;
}